

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O1

void __thiscall
Clasp::MinimizeBuilder::prepareLevels
          (MinimizeBuilder *this,Solver *s,SumVec *adjust,WeightVec *prios)

{
  size_type sVar1;
  MLit *__seed;
  pointer puVar2;
  ulong uVar3;
  long lVar4;
  pointer pMVar5;
  pointer pMVar6;
  pointer pMVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  pointer pMVar12;
  weight_t P;
  wsum_t R;
  uint local_54;
  MinimizeBuilder *local_50;
  _Temporary_buffer<Clasp::MinimizeBuilder::MLit_*,_Clasp::MinimizeBuilder::MLit> local_48;
  
  uVar3 = (ulong)(this->lits_).ebo_.size;
  local_50 = this;
  if (uVar3 != 0) {
    __seed = (this->lits_).ebo_.buf;
    std::_Temporary_buffer<Clasp::MinimizeBuilder::MLit_*,_Clasp::MinimizeBuilder::MLit>::
    _Temporary_buffer(&local_48,__seed,uVar3 + 1 >> 1);
    if (local_48._M_buffer == (pointer)0x0) {
      std::
      __inplace_stable_sort<Clasp::MinimizeBuilder::MLit*,__gnu_cxx::__ops::_Iter_comp_iter<Clasp::MinimizeBuilder::CmpPrio>>
                (__seed,__seed + uVar3);
    }
    else {
      std::
      __stable_sort_adaptive<Clasp::MinimizeBuilder::MLit*,Clasp::MinimizeBuilder::MLit*,long,__gnu_cxx::__ops::_Iter_comp_iter<Clasp::MinimizeBuilder::CmpPrio>>
                (__seed,__seed + uVar3,local_48._M_buffer,local_48._M_len);
    }
    operator_delete(local_48._M_buffer);
  }
  (prios->ebo_).size = 0;
  (adjust->ebo_).size = 0;
  pMVar5 = (local_50->lits_).ebo_.buf;
  uVar3 = (ulong)(local_50->lits_).ebo_.size;
  pMVar7 = pMVar5;
  if (uVar3 != 0) {
    pMVar12 = pMVar5 + uVar3;
    do {
      local_54 = pMVar5->prio;
      sVar1 = (prios->ebo_).size;
      local_48._M_original_len = 0;
      puVar2 = (s->assign_).assign_.ebo_.buf;
      lVar4 = 0;
      do {
        if (pMVar5->prio != local_54) break;
        uVar9 = (pMVar5->lit).rep_;
        lVar8 = (long)pMVar5->weight;
        pMVar6 = pMVar5;
        while (pMVar5 = pMVar6 + 1, pMVar5 != pMVar12) {
          uVar10 = (pMVar5->lit).rep_ ^ uVar9;
          if ((3 < uVar10) || (pMVar6[1].prio != local_54)) break;
          lVar11 = (long)pMVar6[1].weight;
          pMVar6 = pMVar5;
          if (uVar10 < 2) {
            lVar8 = lVar8 + lVar11;
          }
          else {
            lVar8 = lVar8 - lVar11;
            lVar4 = lVar4 + lVar11;
            local_48._M_original_len = lVar4;
          }
        }
        if (lVar8 < 0) {
          lVar4 = lVar4 + lVar8;
          uVar9 = uVar9 & 0xfffffffe ^ 2;
          lVar8 = -lVar8;
          local_48._M_original_len = lVar4;
        }
        if ((lVar8 == 0) || ((*(byte *)((long)puVar2 + (ulong)(uVar9 & 0xfffffffc)) & 3) != 0)) {
          if ((byte)(*(byte *)((long)puVar2 + (ulong)(uVar9 & 0xfffffffc)) & 3) ==
              (byte)(2U - ((uVar9 & 2) == 0))) {
            lVar4 = lVar4 + lVar8;
            local_48._M_original_len = lVar4;
          }
        }
        else {
          if ((int)lVar8 != lVar8) {
            Potassco::fail(0x4b,
                           "void Clasp::MinimizeBuilder::prepareLevels(const Solver &, SumVec &, WeightVec &)"
                           ,0x290,"static_cast<weight_t>(w) == w",
                           "MinimizeBuilder: weight too large",0);
          }
          (pMVar7->lit).rep_ = uVar9;
          pMVar7->prio = sVar1;
          pMVar7->weight = (int)lVar8;
          pMVar7 = pMVar7 + 1;
        }
      } while (pMVar5 != pMVar12);
      bk_lib::pod_vector<int,_std::allocator<int>_>::push_back(prios,(int *)&local_54);
      bk_lib::pod_vector<long,_std::allocator<long>_>::push_back(adjust,&local_48._M_original_len);
    } while (pMVar5 != pMVar12);
  }
  uVar9 = (local_50->lits_).ebo_.size;
  (local_50->lits_).ebo_.size =
       (int)((long)(local_50->lits_).ebo_.buf + ((ulong)uVar9 * 0xc - (long)pMVar7) >> 2) *
       0x55555555 + uVar9;
  return;
}

Assistant:

void MinimizeBuilder::prepareLevels(const Solver& s, SumVec& adjust, WeightVec& prios) {
	// group first by decreasing priorities and then by variables
	std::stable_sort(lits_.begin(), lits_.end(), CmpPrio());
	prios.clear(); adjust.clear();
	// assign levels and simplify lits
	LitVec::iterator j = lits_.begin();
	for (LitVec::const_iterator it = lits_.begin(), end = lits_.end(); it != end;) {
		const weight_t P = it->prio, L = static_cast<weight_t>(prios.size());
		wsum_t R = 0;
		for (LitVec::const_iterator k; it != end && it->prio == P; it = k) {
			Literal x(it->lit); // make literal unique wrt this level
			wsum_t  w = it->weight;
			for (k = it + 1; k != end && k->lit.var() == x.var() && k->prio == P; ++k) {
				if (k->lit == x){ w += k->weight; }
				else            { w -= k->weight; R += k->weight; }
			}
			if (w < 0){
				R += w;
				x  = ~x;
				w  = -w;
			}
			if (w && s.value(x.var()) == value_free) {
				POTASSCO_CHECK(static_cast<weight_t>(w) == w, EOVERFLOW, "MinimizeBuilder: weight too large");
				*j++ = MLit(WeightLiteral(x, static_cast<weight_t>(w)), L);
			}
			else if (s.isTrue(x)) { R += w; }
		}
		prios.push_back(P);
		adjust.push_back(R);
	}
	lits_.erase(j, lits_.end());
}